

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execAddqEa<(moira::Instr)121,(moira::Mode)7,(moira::Size)2>(Moira *this,u16 opcode)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  u32 uVar5;
  ushort in_SI;
  Moira *in_RDI;
  u32 result;
  u32 data;
  u32 ea;
  int dst;
  i8 src;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  u32 in_stack_ffffffffffffffe8;
  u32 in_stack_ffffffffffffffec;
  undefined1 in_stack_fffffffffffffff4;
  
  bVar1 = (byte)((int)(uint)in_SI >> 9);
  bVar2 = bVar1 & 7;
  uVar4 = in_SI & 7;
  bVar3 = readOp<(moira::Mode)7,(moira::Size)2,0ul>
                    (in_RDI,CONCAT22(in_SI,CONCAT11(bVar1,in_stack_fffffffffffffff4)) & 0xffff07ff,
                     (u32 *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                     (u32 *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (bVar3) {
    if (bVar2 == 0) {
      bVar2 = 8;
    }
    uVar5 = addsub<(moira::Instr)121,(moira::Size)2>
                      ((Moira *)CONCAT26(in_SI,CONCAT15(bVar2,CONCAT14(in_stack_fffffffffffffff4,
                                                                       uVar4))),
                       in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
    prefetch<0ul>((Moira *)CONCAT44(uVar5,in_stack_ffffffffffffffe0));
    writeOp<(moira::Mode)7,(moira::Size)2,4ul>
              ((Moira *)CONCAT44(uVar5,in_stack_ffffffffffffffe0),(int)((ulong)in_RDI >> 0x20),
               (u32)in_RDI,0);
  }
  return;
}

Assistant:

void
Moira::execAddqEa(u16 opcode)
{
    i8  src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);

    u32 ea, data, result;
    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;

    if (src == 0) src = 8;
    result = addsub<I,S>(src, data);
    prefetch();

    writeOp<M,S, POLLIPL>(dst, ea, result);
}